

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffinttyp(char *cval,int *dtype,int *negative,int *status)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  ushort **ppuVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  if (0 < *status) {
    return *status;
  }
  *dtype = 0;
  *negative = 0;
  cVar3 = *cval;
  bVar2 = true;
  if (cVar3 == '+') {
LAB_00138818:
    cVar3 = cval[1];
    cval = cval + 1;
  }
  else if (cVar3 == '-') {
    *negative = 1;
    bVar2 = false;
    goto LAB_00138818;
  }
  if (cVar3 == '0') {
    cVar3 = '0';
    while (cVar3 == '0') {
      pcVar1 = cval + 1;
      cval = cval + 1;
      cVar3 = *pcVar1;
    }
    if (cVar3 != '\0') goto LAB_00138839;
  }
  else {
LAB_00138839:
    sVar5 = strlen(cval);
    uVar9 = 0;
    uVar8 = (uint)sVar5;
    uVar7 = 0;
    if (0 < (int)uVar8) {
      uVar7 = sVar5 & 0xffffffff;
    }
    while (uVar7 != uVar9) {
      ppuVar6 = __ctype_b_loc();
      pcVar1 = cval + uVar9;
      uVar9 = uVar9 + 1;
      if ((*(byte *)((long)*ppuVar6 + (long)*pcVar1 * 2 + 1) & 8) == 0) {
        *status = 0x193;
        return 0x193;
      }
    }
    if (uVar8 == 0) {
      *status = 0xcc;
      goto LAB_001388dd;
    }
    if (2 < (int)uVar8) {
      if (uVar8 == 4) goto LAB_001388a2;
      if (uVar8 - 6 < 4) goto LAB_001388b5;
      if (uVar8 - 0xb < 8) goto LAB_001388c8;
      if (uVar8 < 0x15) {
        if (bVar2) {
          if (uVar8 != 0x14) {
            if (uVar8 != 5) {
              if (uVar8 == 10) {
                iVar4 = strcmp(cval,"2147483647");
                if (iVar4 < 1) goto LAB_001388b5;
                iVar4 = strcmp(cval,"4294967295");
                if (iVar4 < 1) {
                  *dtype = 0x1e;
                  goto LAB_001388dd;
                }
              }
              else {
                if (uVar8 != 0x13) {
                  if (uVar8 != 3) goto LAB_001388dd;
                  iVar4 = strcmp(cval,"127");
                  if (iVar4 < 1) goto LAB_0013888b;
                  iVar4 = strcmp(cval,"255");
                  if (iVar4 < 1) {
                    *dtype = 0xb;
                    goto LAB_001388dd;
                  }
                  goto LAB_001388a2;
                }
                iVar4 = strcmp(cval,"9223372036854775807");
                if (0 < iVar4) goto LAB_00138a8a;
              }
LAB_001388c8:
              *dtype = 0x51;
              goto LAB_001388dd;
            }
            iVar4 = strcmp(cval,"32767");
            if (0 < iVar4) {
              iVar4 = strcmp(cval,"65535");
              if (iVar4 < 1) {
                *dtype = 0x14;
                goto LAB_001388dd;
              }
              goto LAB_001388b5;
            }
            goto LAB_001388a2;
          }
          iVar4 = strcmp(cval,"18446744073709551615");
          if (iVar4 < 1) {
LAB_00138a8a:
            *dtype = 0x50;
            goto LAB_001388dd;
          }
        }
        else {
          if (uVar8 != 0x13) {
            if (uVar8 == 5) {
              iVar4 = strcmp(cval,"32768");
              if (0 < iVar4) goto LAB_001388b5;
            }
            else {
              if (uVar8 == 10) {
                iVar4 = strcmp(cval,"2147483648");
                if (0 < iVar4) goto LAB_001388c8;
LAB_001388b5:
                *dtype = 0x1f;
                goto LAB_001388dd;
              }
              if (uVar8 != 3) goto LAB_001388dd;
              iVar4 = strcmp(cval,"128");
              if (iVar4 < 1) goto LAB_0013888b;
            }
LAB_001388a2:
            *dtype = 0x15;
            goto LAB_001388dd;
          }
          iVar4 = strcmp(cval,"9223372036854775808");
          if (iVar4 < 1) goto LAB_001388c8;
        }
      }
      *status = 0x193;
      goto LAB_001388dd;
    }
  }
LAB_0013888b:
  *dtype = 0xc;
LAB_001388dd:
  return *status;
}

Assistant:

int ffinttyp(char *cval,  /* I - formatted string representation of the integer */
           int *dtype, /* O - datatype code: TBYTE, TSHORT, TUSHORT, etc */
           int *negative, /* O - is cval negative? */
           int *status)  /* IO - error status */
/*
  determine implicit datatype of input integer string.
  This assumes that the string conforms to the FITS standard
  for integer keyword value, so may not detect all invalid formats.
*/
{
    int ii, len;
    char *p;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *dtype = 0;  /* initialize to NULL */
    *negative = 0;
    p = cval;

    if (*p == '+') {
        p++;   /* ignore leading + sign */
    } else if (*p == '-') {
        p++;
	*negative = 1;   /* this is a negative number */
    }

    if (*p == '0') {
        while (*p == '0') p++;  /* skip leading zeros */

        if (*p == 0) {  /* the value is a string of 1 or more zeros */
           *dtype  = TSBYTE;
	   return(*status);
        }
    }

    len = strlen(p);
    for (ii = 0; ii < len; ii++)  {
        if (!isdigit(*(p+ii))) {
	    *status = BAD_INTKEY;
	    return(*status);
	}
    }

    /* check for unambiguous cases, based on length of the string */
    if (len == 0) {
        *status = VALUE_UNDEFINED;
    } else if (len < 3) {
        *dtype = TSBYTE;
    } else if (len == 4) {
	*dtype = TSHORT;
    } else if (len > 5 && len < 10) {
        *dtype = TINT;
    } else if (len > 10 && len < 19) {
        *dtype = TLONGLONG;
    } else if (len > 20) {
	*status = BAD_INTKEY;
    } else {
    
      if (!(*negative)) {  /* positive integers */
	if (len == 3) {
	    if (strcmp(p,"127") <= 0 ) {
	        *dtype = TSBYTE;
	    } else if (strcmp(p,"255") <= 0 ) {
	        *dtype = TBYTE;
	    } else {
	        *dtype = TSHORT;
	    }
	} else if (len == 5) {
 	    if (strcmp(p,"32767") <= 0 ) {
	        *dtype = TSHORT;
 	    } else if (strcmp(p,"65535") <= 0 ) {
	        *dtype = TUSHORT;
	    } else {
	        *dtype = TINT;
	    }
	} else if (len == 10) {
	    if (strcmp(p,"2147483647") <= 0 ) {
	        *dtype = TINT;
	    } else if (strcmp(p,"4294967295") <= 0 ) {
	        *dtype = TUINT;
	    } else {
	        *dtype = TLONGLONG;
	    }
	} else if (len == 19) {
	    if (strcmp(p,"9223372036854775807") <= 0 ) {
	        *dtype = TLONGLONG;
	    } else {
		*dtype = TULONGLONG;
	    }
	} else if (len == 20) {
	    if (strcmp(p,"18446744073709551615") <= 0 ) {
	        *dtype = TULONGLONG;
	    } else {
	        *status = BAD_INTKEY;
	    }
	}

      } else {  /* negative integers */
	if (len == 3) {
	    if (strcmp(p,"128") <= 0 ) {
	        *dtype = TSBYTE;
	    } else {
	        *dtype = TSHORT;
	    }
	} else if (len == 5) {
 	    if (strcmp(p,"32768") <= 0 ) {
	        *dtype = TSHORT;
	    } else {
	        *dtype = TINT;
	    }
	} else if (len == 10) {
	    if (strcmp(p,"2147483648") <= 0 ) {
	        *dtype = TINT;
	    } else {
	        *dtype = TLONGLONG;
	    }
	} else if (len == 19) {
	    if (strcmp(p,"9223372036854775808") <= 0 ) {
	        *dtype = TLONGLONG;
	    } else {
		*status = BAD_INTKEY;
	    }
	}
      }
    }

    return(*status);
}